

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O3

int __thiscall kj::_::Debug::Fault::init(Fault *this,EVP_PKEY_CTX *ctx)

{
  ArrayPtr<kj::String> argValues;
  char *pcVar1;
  size_t sVar2;
  uint uVar3;
  Exception *this_00;
  Type in_ECX;
  int in_EDX;
  char *in_R8;
  char *in_R9;
  char *in_stack_00000008;
  String *in_stack_00000010;
  String local_48;
  
  this_00 = (Exception *)operator_new(0x158);
  argValues.size_ = (size_t)this;
  argValues.ptr = in_stack_00000010;
  anon_unknown_2::makeDescriptionImpl(&local_48,ASSERTION,in_R8,0,in_R9,in_stack_00000008,argValues)
  ;
  Exception::Exception(this_00,in_ECX,(char *)ctx,in_EDX,&local_48);
  sVar2 = local_48.content.size_;
  pcVar1 = local_48.content.ptr;
  this->exception = this_00;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    uVar3 = (**(local_48.content.disposer)->_vptr_ArrayDisposer)
                      (local_48.content.disposer,pcVar1,1,sVar2,sVar2,0);
    this = (Fault *)(ulong)uVar3;
  }
  return (int)this;
}

Assistant:

void Debug::Fault::init(
    const char* file, int line, Exception::Type type,
    const char* condition, const char* macroArgs, ArrayPtr<String> argValues) {
  exception = new Exception(type, file, line,
      makeDescriptionImpl(ASSERTION, condition, 0, nullptr, macroArgs, argValues));
}